

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O2

void __thiscall
slang::DiagnosticClient::getIncludeStack
          (DiagnosticClient *this,BufferID buffer,SmallVectorBase<slang::SourceLocation> *stack)

{
  SourceLocation in_RAX;
  SourceLocation loc;
  SourceLocation local_28;
  
  stack->len = 0;
  local_28 = in_RAX;
  while( true ) {
    if (buffer.id == 0) {
      return;
    }
    local_28 = SourceManager::getIncludedFrom(this->sourceManager,buffer);
    if (((ulong)local_28 & 0xfffffff) == 0) break;
    SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation_const&>
              (stack,&local_28);
    buffer.id = local_28._0_4_ & 0xfffffff;
  }
  return;
}

Assistant:

void DiagnosticClient::getIncludeStack(BufferID buffer,
                                       SmallVectorBase<SourceLocation>& stack) const {
    stack.clear();
    while (buffer) {
        SourceLocation loc = sourceManager->getIncludedFrom(buffer);
        if (!loc.buffer())
            break;

        stack.push_back(loc);
        buffer = loc.buffer();
    }
}